

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O2

void __thiscall WorkItemScheduler::work_dispatch(WorkItemScheduler *this)

{
  bool bVar1;
  int iVar2;
  errc *peVar3;
  ssize_t sVar4;
  mapped_type *pmVar5;
  system_error *this_00;
  undefined4 uVar6;
  error_code eVar7;
  error_code __ec;
  error_code __ec_00;
  Events event;
  epoll_event local_48;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *local_38;
  
  local_48.data.fd = 0;
  local_48.events = 0;
  local_48._4_4_ = 0;
  event = NONE;
  local_38 = &this->fd_worker_map_;
  bVar1 = false;
  uVar6 = NONE;
LAB_0010524d:
  do {
    local_48.data.u64._4_4_ = uVar6;
    if ((this->active_ == false) &&
       ((this->work_).
        super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->work_).
        super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
      return;
    }
    uVar6 = local_48.data.u64._4_4_;
    if (!bVar1) {
      local_48.events = 0;
      local_48._4_4_ = 0;
      local_48.data.fd = 0;
      while (iVar2 = epoll_wait(this->epoll_fd_,&local_48,1,100), iVar2 == -1) {
        peVar3 = (errc *)__errno_location();
        if (*peVar3 != interrupted) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          eVar7 = std::make_error_code(*peVar3);
          __ec._M_cat = eVar7._M_cat;
          __ec._4_4_ = 0;
          __ec._M_value = eVar7._M_value;
          std::system_error::system_error(this_00,__ec,"Call to epoll_wait(2) failed");
          goto LAB_0010534b;
        }
      }
      if (iVar2 == 0) {
        bVar1 = false;
        uVar6 = local_48.data.u64._4_4_;
        goto LAB_0010524d;
      }
      while (sVar4 = read(local_48._4_4_,&event,4), uVar6 = event, (int)sVar4 == -1) {
        peVar3 = (errc *)__errno_location();
        if (*peVar3 != interrupted) {
          this_00 = (system_error *)__cxa_allocate_exception(0x20);
          eVar7 = std::make_error_code(*peVar3);
          __ec_00._M_cat = eVar7._M_cat;
          __ec_00._4_4_ = 0;
          __ec_00._M_value = eVar7._M_value;
          std::system_error::system_error(this_00,__ec_00,"Call to read(2) failed");
LAB_0010534b:
          __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
        }
      }
    }
    bVar1 = false;
    if (uVar6 == WORK_REQ) {
      pmVar5 = std::
               map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               ::operator[](local_38,(key_type *)&local_48.field_0x4);
      bVar1 = try_send_work(this,*pmVar5);
      bVar1 = !bVar1;
      uVar6 = WORK_REQ;
    }
  } while( true );
}

Assistant:

void WorkItemScheduler::work_dispatch()
{
    bool skip_polling = false;
    struct epoll_event ev = {0};
    Events event = Events::NONE;

    while (this->active_ || !this->work_.empty())
    {
        int rv = 0;

        if (!skip_polling)
        {
            ev = {0};
            do
            {
                rv = epoll_wait(this->epoll_fd_, &ev, 1, 100);
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to epoll_wait(2) failed");
            } while (rv == -1);

            if (rv == 0)
                continue;

            do
            {
                rv = read(ev.data.fd, &event, sizeof(event));
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to read(2) failed");
            } while (rv == -1);
        }

        switch (event)
        {
            case Events::WORK_REQ:
                skip_polling =
                    !this->try_send_work(this->fd_worker_map_[ev.data.fd]);
                break;
            default:
                skip_polling = false;
                break;
        }
    }
}